

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

string * lest::make_tran_string(string *__return_storage_ptr__,string *txt)

{
  byte c;
  string *psVar1;
  long lVar2;
  byte *pbVar3;
  ostringstream os;
  allocator<char> local_1d1;
  string local_1d0;
  string *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1b0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  if (txt->_M_string_length != 0) {
    pbVar3 = (byte *)(txt->_M_dataplus)._M_p;
    do {
      c = *pbVar3;
      lVar2 = 8;
      do {
        if (*(byte *)((long)&PTR_typeinfo_001a4d28 + lVar2) == c) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1d0,*(char **)(&DAT_001a4d30 + lVar2),&local_1d1);
          goto LAB_0018a33a;
        }
        lVar2 = lVar2 + 0x10;
      } while (lVar2 != 0x58);
      if (c < 0x20) {
        to_hex_string_abi_cxx11_(&local_1d0,(lest *)(ulong)(uint)(int)(char)c,c);
      }
      else {
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_1d0,'\x01');
      }
LAB_0018a33a:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != (byte *)((txt->_M_dataplus)._M_p + txt->_M_string_length));
  }
  psVar1 = local_1b0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar1;
}

Assistant:

inline std::string make_tran_string( std::string const & txt )
{
    std::ostringstream os;
    for( std::string::const_iterator pos = txt.begin(); pos != txt.end(); ++pos )
        os << transformed( *pos );
    return os.str();
}